

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_prim.c
# Opt level: O2

void TexturePrimitives(int mode)

{
  int iVar1;
  long lVar2;
  ushort uVar3;
  undefined8 in_RSI;
  ushort uVar4;
  ulong uVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined8 uVar9;
  undefined8 in_XMM1_Qa;
  undefined1 auVar10 [16];
  
  if (mode == 2) {
    al_set_blender(0,1,Blend != 0);
    al_use_transform(&MainTrans);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,0,4,0);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,4,9,1);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,9,0xd,2);
    al_draw_prim(TexturePrimitives::vtx2,0,Texture,0,0xd,6);
    al_use_transform(&Identity);
    return;
  }
  if (mode != 1) {
    if (mode == 0) {
      uVar3 = 2;
      uVar4 = 1;
      lVar6 = 0;
      lVar2 = 0;
      uVar5 = 0;
      while( true ) {
        if (lVar2 == 0x340) break;
        fVar7 = (float)(int)uVar5 / 13.0;
        fVar7 = (fVar7 + fVar7) * 3.1415927;
        fVar8 = cosf(fVar7);
        fVar7 = sinf(fVar7);
        iVar1 = (int)lVar2;
        uVar9 = al_map_rgb((uint)(byte)((char)(uVar4 / 3) * '@' + 0x40) + iVar1 & 0xff,
                           (uint)(byte)((char)(uVar3 / 3) * '@' + 0x80) + iVar1 & 0xff,
                           (uint)(byte)((char)(((ushort)uVar5 & 0xff) / 3) << 6) + iVar1 & 0xff);
        fVar8 = fVar8 * 200.0;
        fVar7 = fVar7 * 200.0;
        *(ulong *)((long)&TexturePrimitives::vtx[0].x + lVar6) = CONCAT44(fVar7,fVar8);
        *(undefined4 *)((long)&TexturePrimitives::vtx[0].z + lVar6) = 0;
        *(ulong *)((long)&TexturePrimitives::vtx2[0].x + lVar6) = CONCAT44(fVar7 * 0.1,fVar8 * 0.1);
        auVar10._0_4_ = fVar8 * 64.0;
        auVar10._4_4_ = fVar7 * 64.0;
        auVar10._8_4_ = extraout_XMM0_Db * 0.0 * 0.0;
        auVar10._12_4_ = extraout_XMM0_Db_00 * 0.0 * 0.0;
        auVar10 = divps(auVar10,_DAT_001071a0);
        *(long *)((long)&TexturePrimitives::vtx[0].u + lVar6) = auVar10._0_8_;
        *(long *)((long)&TexturePrimitives::vtx2[0].u + lVar6) = auVar10._0_8_;
        if (uVar5 < 10) {
          in_XMM1_Qa = 0x3f800000;
          uVar9 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
        }
        *(undefined8 *)((long)&TexturePrimitives::vtx[0].color.r + lVar6) = uVar9;
        *(int *)((long)&TexturePrimitives::vtx[0].color.b + lVar6) = (int)in_XMM1_Qa;
        *(int *)((long)&TexturePrimitives::vtx[0].color.a + lVar6) =
             (int)((ulong)in_XMM1_Qa >> 0x20);
        uVar9 = *(undefined8 *)((long)&TexturePrimitives::vtx[0].color.b + lVar6);
        *(undefined8 *)((long)&TexturePrimitives::vtx2[0].color.r + lVar6) =
             *(undefined8 *)((long)&TexturePrimitives::vtx[0].color.r + lVar6);
        *(undefined8 *)((long)&TexturePrimitives::vtx2[0].color.b + lVar6) = uVar9;
        uVar3 = (ushort)(byte)((char)uVar3 + 1);
        lVar2 = lVar2 + 0x40;
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x24;
        uVar4 = (ushort)(byte)((char)uVar4 + 1);
      }
    }
    return;
  }
  Theta = Speed + Theta;
  al_build_transform((float)(ScreenW / 2),(float)(ScreenH / 2),&MainTrans,in_RSI,
                     (long)ScreenH % 2 & 0xffffffff);
  return;
}

Assistant:

static void TexturePrimitives(int mode)
{
   static ALLEGRO_VERTEX vtx[13];
   static ALLEGRO_VERTEX vtx2[13];
   if (mode == INIT) {
      int ii = 0;
      ALLEGRO_COLOR color;
      for (ii = 0; ii < 13; ii++) {
         float x, y;
         x = 200 * cosf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         y = 200 * sinf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         
         color = al_map_rgb((ii + 1) % 3 * 64, (ii + 2) % 3 * 64, (ii) % 3 * 64);
         
         vtx[ii].x = x; vtx[ii].y = y; vtx[ii].z = 0;
         vtx2[ii].x = 0.1 * x; vtx2[ii].y = 0.1 * y;
         vtx[ii].u = 64 * x / 100; vtx[ii].v = 64 * y / 100;
         vtx2[ii].u = 64 * x / 100; vtx2[ii].v = 64 * y / 100;
         if(ii < 10)
            vtx[ii].color = al_map_rgba_f(1, 1, 1, 1);
         else
            vtx[ii].color = color;
         vtx2[ii].color = vtx[ii].color;
      }
   } else if (mode == LOGIC) {
      Theta += Speed;
      al_build_transform(&MainTrans, ScreenW / 2, ScreenH / 2, 1, 1, Theta);
   } else if (mode == DRAW) {
      if (Blend)
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ONE);
      else
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      
      al_use_transform(&MainTrans);
      
      al_draw_prim(vtx, 0, Texture, 0, 4, ALLEGRO_PRIM_LINE_LIST);
      al_draw_prim(vtx, 0, Texture, 4, 9, ALLEGRO_PRIM_LINE_STRIP);
      al_draw_prim(vtx, 0, Texture, 9, 13, ALLEGRO_PRIM_LINE_LOOP);
      al_draw_prim(vtx2, 0, Texture, 0, 13, ALLEGRO_PRIM_POINT_LIST);
      
      al_use_transform(&Identity);
   }
}